

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O1

void deqp::egl::anon_unknown_4::randomizeDrawOp(Random *rnd,DrawPrimitiveOp *drawOp)

{
  int i;
  deUint32 dVar1;
  DepthMode DVar2;
  StencilMode SVar3;
  long lVar4;
  pointer pVVar5;
  pointer pVVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vec2 e01;
  Vec2 csp2;
  Vec2 csp1;
  Vector<float,_2> res_4;
  Vec2 csp0;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  long local_70;
  float local_68 [4];
  DrawPrimitiveOp *local_58;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_50;
  long local_48;
  pointer local_40;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_38;
  
  deRandom_getUint32(&rnd->m_rnd);
  drawOp->type = PRIMITIVETYPE_TRIANGLE;
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->count = dVar1 % 3 + 2;
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->blend = dVar1 % 3;
  DVar2 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->depth = DVar2 & DEPTHMODE_LESS;
  SVar3 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->stencil = SVar3 & STENCILMODE_LEQUAL_INC;
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->stencilRef = dVar1 % 9;
  if (drawOp->type == PRIMITIVETYPE_TRIANGLE) {
    local_50 = &drawOp->positions;
    local_58 = drawOp;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (local_50,(long)(drawOp->count * 3));
    local_38 = &drawOp->colors;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (local_38,(long)(drawOp->count * 3));
    if (0 < drawOp->count) {
      lVar8 = 0;
      local_70 = 0;
      do {
        fVar10 = deRandom_getFloat(&rnd->m_rnd);
        fVar13 = fVar10 + fVar10 + -1.0;
        fVar10 = deRandom_getFloat(&rnd->m_rnd);
        fVar10 = fVar10 + fVar10 + -1.0;
        lVar4 = 3;
        local_48 = lVar8;
        do {
          pVVar6 = (local_50->
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar9 = lVar8 >> 0x1c;
          pVVar5 = (local_38->
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          fVar11 = deRandom_getFloat(&rnd->m_rnd);
          *(float *)((long)pVVar6->m_data + lVar9) = fVar11 + fVar11 + -1.0 + fVar13;
          fVar11 = deRandom_getFloat(&rnd->m_rnd);
          *(float *)((long)pVVar6->m_data + lVar9 + 4) = fVar11 + fVar11 + -1.0 + fVar10;
          fVar11 = deRandom_getFloat(&rnd->m_rnd);
          *(float *)((long)pVVar6->m_data + lVar9 + 8) = fVar11 + fVar11 + -1.0;
          *(undefined4 *)((long)pVVar6->m_data + lVar9 + 0xc) = 0x3f800000;
          fVar11 = deRandom_getFloat(&rnd->m_rnd);
          *(float *)((long)pVVar5->m_data + lVar9) = fVar11 * 0.7 + 0.2;
          fVar11 = deRandom_getFloat(&rnd->m_rnd);
          *(float *)((long)pVVar5->m_data + lVar9 + 4) = fVar11 * 0.7 + 0.2;
          fVar11 = deRandom_getFloat(&rnd->m_rnd);
          *(float *)((long)pVVar5->m_data + lVar9 + 8) = fVar11 * 0.7 + 0.2;
          fVar11 = deRandom_getFloat(&rnd->m_rnd);
          *(float *)((long)pVVar5->m_data + lVar9 + 0xc) = fVar11 * 0.7 + 0.3;
          lVar8 = lVar8 + 0x100000000;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        iVar7 = (int)local_70;
        pVVar6 = (local_50->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        local_40 = pVVar6 + iVar7 * 3;
        pVVar5 = pVVar6 + (iVar7 * 3 + 1);
        pVVar6 = pVVar6 + (iVar7 * 3 + 2);
        iVar7 = 0;
        do {
          local_78 = *(undefined8 *)local_40->m_data;
          fVar11 = local_40->m_data[3];
          local_68[2] = 0.0;
          local_68[3] = 0.0;
          lVar8 = 0;
          do {
            local_68[lVar8 + 2] = *(float *)((long)&local_78 + lVar8 * 4) / fVar11;
            lVar8 = lVar8 + 1;
          } while (lVar8 == 1);
          local_80 = *(undefined8 *)pVVar5->m_data;
          fVar11 = pVVar5->m_data[3];
          local_78 = 0;
          lVar8 = 0;
          do {
            *(float *)((long)&local_78 + lVar8 * 4) =
                 *(float *)((long)&local_80 + lVar8 * 4) / fVar11;
            lVar8 = lVar8 + 1;
          } while (lVar8 == 1);
          local_88 = *(undefined8 *)pVVar6->m_data;
          fVar11 = pVVar6->m_data[3];
          local_80 = 0;
          lVar8 = 0;
          do {
            *(float *)((long)&local_80 + lVar8 * 4) =
                 *(float *)((long)&local_88 + lVar8 * 4) / fVar11;
            lVar8 = lVar8 + 1;
          } while (lVar8 == 1);
          local_88 = 0;
          lVar8 = 0;
          do {
            *(float *)((long)&local_88 + lVar8 * 4) =
                 *(float *)((long)&local_78 + lVar8 * 4) - local_68[lVar8 + 2];
            lVar8 = lVar8 + 1;
          } while (lVar8 == 1);
          local_68[0] = 0.0;
          local_68[1] = 0.0;
          lVar8 = 0;
          do {
            local_68[lVar8] = *(float *)((long)&local_80 + lVar8 * 4) - local_68[lVar8 + 2];
            lVar8 = lVar8 + 1;
          } while (lVar8 == 1);
          fVar12 = (float)local_88 * local_68[1] - local_88._4_4_ * local_68[0];
          fVar11 = -fVar12;
          if (-fVar12 <= fVar12) {
            fVar11 = fVar12;
          }
          if (0.4 <= fVar11 * 0.5) break;
          fVar11 = deRandom_getFloat(&rnd->m_rnd);
          pVVar5->m_data[0] = fVar11 + fVar11 + -1.0 + fVar13;
          fVar11 = deRandom_getFloat(&rnd->m_rnd);
          pVVar5->m_data[1] = fVar11 + fVar11 + -1.0 + fVar10;
          fVar11 = deRandom_getFloat(&rnd->m_rnd);
          pVVar5->m_data[2] = fVar11 + fVar11 + -1.0;
          pVVar5->m_data[3] = 1.0;
          fVar11 = deRandom_getFloat(&rnd->m_rnd);
          pVVar6->m_data[0] = fVar11 + fVar11 + -1.0 + fVar13;
          fVar11 = deRandom_getFloat(&rnd->m_rnd);
          pVVar6->m_data[1] = fVar11 + fVar11 + -1.0 + fVar10;
          fVar11 = deRandom_getFloat(&rnd->m_rnd);
          pVVar6->m_data[2] = fVar11 + fVar11 + -1.0;
          pVVar6->m_data[3] = 1.0;
          iVar7 = iVar7 + 1;
        } while (iVar7 != 0x29);
        local_70 = local_70 + 1;
        lVar8 = local_48 + 0x300000000;
      } while (local_70 < local_58->count);
    }
  }
  return;
}

Assistant:

void randomizeDrawOp (de::Random& rnd, DrawPrimitiveOp& drawOp)
{
	const int	minStencilRef	= 0;
	const int	maxStencilRef	= 8;
	const int	minPrimitives	= 2;
	const int	maxPrimitives	= 4;

	const float	maxTriOffset	= 1.0f;
	const float	minDepth		= -1.0f; // \todo [pyry] Reference doesn't support Z clipping yet
	const float	maxDepth		= 1.0f;

	const float	minRGB			= 0.2f;
	const float	maxRGB			= 0.9f;
	const float	minAlpha		= 0.3f;
	const float	maxAlpha		= 1.0f;

	drawOp.type			= (PrimitiveType)rnd.getInt(0, PRIMITIVETYPE_LAST-1);
	drawOp.count		= rnd.getInt(minPrimitives, maxPrimitives);
	drawOp.blend		= (BlendMode)rnd.getInt(0, BLENDMODE_LAST-1);
	drawOp.depth		= (DepthMode)rnd.getInt(0, DEPTHMODE_LAST-1);
	drawOp.stencil		= (StencilMode)rnd.getInt(0, STENCILMODE_LAST-1);
	drawOp.stencilRef	= rnd.getInt(minStencilRef, maxStencilRef);

	if (drawOp.type == PRIMITIVETYPE_TRIANGLE)
	{
		drawOp.positions.resize(drawOp.count*3);
		drawOp.colors.resize(drawOp.count*3);

		for (int triNdx = 0; triNdx < drawOp.count; triNdx++)
		{
			const float		cx		= rnd.getFloat(-1.0f, 1.0f);
			const float		cy		= rnd.getFloat(-1.0f, 1.0f);

			for (int coordNdx = 0; coordNdx < 3; coordNdx++)
			{
				tcu::Vec4&	position	= drawOp.positions[triNdx*3 + coordNdx];
				tcu::Vec4&	color		= drawOp.colors[triNdx*3 + coordNdx];

				position.x()	= cx + rnd.getFloat(-maxTriOffset, maxTriOffset);
				position.y()	= cy + rnd.getFloat(-maxTriOffset, maxTriOffset);
				position.z()	= rnd.getFloat(minDepth, maxDepth);
				position.w()	= 1.0f;

				color.x()		= rnd.getFloat(minRGB, maxRGB);
				color.y()		= rnd.getFloat(minRGB, maxRGB);
				color.z()		= rnd.getFloat(minRGB, maxRGB);
				color.w()		= rnd.getFloat(minAlpha, maxAlpha);
			}

			// avoid generating narrow triangles
			{
				const int	maxAttempts	= 40;
				int			numAttempts	= 0;
				tcu::Vec4&	p0			= drawOp.positions[triNdx*3 + 0];
				tcu::Vec4&	p1			= drawOp.positions[triNdx*3 + 1];
				tcu::Vec4&	p2			= drawOp.positions[triNdx*3 + 2];

				while (isANarrowScreenSpaceTriangle(p0, p1, p2))
				{
					p1.x()	= cx + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p1.y()	= cy + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p1.z()	= rnd.getFloat(minDepth, maxDepth);
					p1.w()	= 1.0f;

					p2.x()	= cx + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p2.y()	= cy + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p2.z()	= rnd.getFloat(minDepth, maxDepth);
					p2.w()	= 1.0f;

					if (++numAttempts > maxAttempts)
					{
						DE_ASSERT(false);
						break;
					}
				}
			}
		}
	}
	else
		DE_ASSERT(false);
}